

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O2

char __thiscall dap::ContentReader::matchAny(ContentReader *this,char *chars)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = buffer(this,1);
  if ((bVar1) &&
     (pcVar2 = strchr(chars,(uint)*(this->buf).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur),
     pcVar2 != (char *)0x0)) {
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->buf);
    return *pcVar2;
  }
  return '\0';
}

Assistant:

char ContentReader::matchAny(const char* chars) {
  if (!buffer(1)) {
    return false;
  }
  int c = buf.front();
  if (auto p = strchr(chars, c)) {
    buf.pop_front();
    return *p;
  }
  return 0;
}